

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> __thiscall
cmMakefileTargetGenerator::CreateLinkLineComputer
          (cmMakefileTargetGenerator *this,cmOutputConverter *outputConverter,
          cmStateDirectory *stateDir)

{
  cmMakefile *this_00;
  cmOutputConverter *outputConverter_00;
  bool bVar1;
  allocator<char> local_51;
  string local_50;
  
  this_00 = (cmMakefile *)(outputConverter->StateSnapshot).Position.Position;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"MSVC60",&local_51);
  bVar1 = cmMakefile::IsOn(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  outputConverter_00 = *(cmOutputConverter **)&outputConverter[1].LinkScriptShell;
  if (bVar1) {
    cmGlobalGenerator::CreateMSVC60LinkLineComputer
              ((cmGlobalGenerator *)this,outputConverter_00,stateDir);
  }
  else {
    (*(code *)(((outputConverter_00->StateSnapshot).State)->ScriptedCommands)._M_h._M_buckets)
              (this,outputConverter_00,stateDir);
  }
  return (__uniq_ptr_data<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>,_true,_true>)
         (__uniq_ptr_data<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmLinkLineComputer>
cmMakefileTargetGenerator::CreateLinkLineComputer(
  cmOutputConverter* outputConverter, cmStateDirectory const& stateDir)
{
  if (this->Makefile->IsOn("MSVC60")) {
    return this->GlobalGenerator->CreateMSVC60LinkLineComputer(outputConverter,
                                                               stateDir);
  }
  return this->GlobalGenerator->CreateLinkLineComputer(outputConverter,
                                                       stateDir);
}